

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndMainMenuBar(void)

{
  ImGuiContext *g;
  ImGuiWindow *in_stack_00000018;
  ImGuiWindow *in_stack_00000020;
  
  EndMenuBar();
  if (((GImGui->CurrentWindow == GImGui->NavWindow) && (GImGui->NavLayer == ImGuiNavLayer_Main)) &&
     ((GImGui->NavAnyRequest & 1U) == 0)) {
    FocusTopMostWindowUnderOne(in_stack_00000020,in_stack_00000018);
  }
  End();
  return;
}

Assistant:

void ImGui::EndMainMenuBar()
{
    EndMenuBar();

    // When the user has left the menu layer (typically: closed menus through activation of an item), we restore focus to the previous window
    // FIXME: With this strategy we won't be able to restore a NULL focus.
    ImGuiContext& g = *GImGui;
    if (g.CurrentWindow == g.NavWindow && g.NavLayer == 0 && !g.NavAnyRequest)
        FocusTopMostWindowUnderOne(g.NavWindow, NULL);

    End();
}